

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xml.cpp
# Opt level: O0

bool __thiscall Xml::Private::parseElement(Private *this,Element *element)

{
  usize *this_00;
  int iVar1;
  undefined4 uVar2;
  bool bVar3;
  List<Xml::Variant> *pLVar4;
  Variant *this_01;
  Element *element_00;
  String local_218;
  String local_1f0;
  String local_1c8;
  String local_1a0;
  String local_178;
  Variant local_150;
  undefined1 local_138 [8];
  String string;
  Variant *variant;
  Position pos;
  String local_b0;
  uint local_84;
  undefined1 local_80 [8];
  String attributeName;
  String local_48;
  Element *local_20;
  Element *element_local;
  Private *this_local;
  
  element->line = (this->token).pos.line;
  element->column = ((int)(this->token).pos.pos - (int)(this->token).pos.lineStart) + 1;
  local_20 = element;
  element_local = (Element *)this;
  bVar3 = readToken(this);
  if (bVar3) {
    if ((this->token).type == nameType) {
      String::operator=(&local_20->type,&(this->token).value);
      do {
        do {
          bVar3 = readToken(this);
          if (!bVar3) {
            this_local._7_1_ = 0;
            goto LAB_0010cc48;
          }
          if ((this->token).type == emptyTagEndType) {
            this_local._7_1_ = 1;
            goto LAB_0010cc48;
          }
          if ((this->token).type == tagEndType) goto LAB_0010c7d9;
        } while ((this->token).type != nameType);
        String::String((String *)local_80,&(this->token).value);
        bVar3 = readToken(this);
        if (bVar3) {
          if ((this->token).type == equalsSignType) {
            bVar3 = readToken(this);
            if (bVar3) {
              if ((this->token).type == stringType) {
                HashMap<String,_String>::append
                          (&local_20->attributes,(String *)local_80,&(this->token).value);
                local_84 = 3;
              }
              else {
                String::String<16ul>((String *)&pos.lineStart,(char (*) [16])"Expected string");
                syntaxError(this,&(this->token).pos,(String *)&pos.lineStart);
                this_local._7_1_ = 0;
                String::~String((String *)&pos.lineStart);
                local_84 = 1;
              }
            }
            else {
              this_local._7_1_ = 0;
              local_84 = 1;
            }
          }
          else {
            String::String<13ul>(&local_b0,(char (*) [13])"Expected \'=\'");
            syntaxError(this,&(this->token).pos,&local_b0);
            this_local._7_1_ = 0;
            String::~String(&local_b0);
            local_84 = 1;
          }
        }
        else {
          this_local._7_1_ = 0;
          local_84 = 1;
        }
        String::~String((String *)local_80);
      } while (local_84 != 1);
    }
    else {
      String::String<18ul>(&local_48,(char (*) [18])"Expected tag name");
      syntaxError(this,&(this->token).pos,&local_48);
      this_local._7_1_ = 0;
      String::~String(&local_48);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  goto LAB_0010cc48;
  while( true ) {
    String::String((String *)local_138);
    bVar3 = parseText(this,(String *)local_138);
    if (bVar3) {
      pLVar4 = &local_20->content;
      Variant::Variant(&local_150,(String *)local_138);
      List<Xml::Variant>::append(pLVar4,&local_150);
      Variant::~Variant(&local_150);
    }
    else {
      this_local._7_1_ = 0;
    }
    local_84 = (uint)!bVar3;
    String::~String((String *)local_138);
    if (local_84 != 0) break;
LAB_0010c7d9:
    iVar1 = (this->pos).line;
    uVar2 = *(undefined4 *)&(this->pos).field_0x4;
    pos._0_8_ = (this->pos).pos;
    pos.pos = (this->pos).lineStart;
    bVar3 = readToken(this);
    if (bVar3) {
      if ((this->token).type == endTagBeginType) {
        bVar3 = readToken(this);
        if (bVar3) {
          if ((this->token).type == nameType) {
            bVar3 = String::operator!=(&(this->token).value,&local_20->type);
            if (bVar3) {
              String::String<22ul>(&local_1f0,(char (*) [22])"Expected end tag of \'");
              String::operator+(&local_1c8,&local_1f0,&local_20->type);
              String::operator+(&local_1a0,&local_1c8,(char (*) [2])0x113aa6);
              syntaxError(this,&(this->token).pos,&local_1a0);
              this_local._7_1_ = 0;
              String::~String(&local_1a0);
              String::~String(&local_1c8);
              String::~String(&local_1f0);
            }
            else {
              bVar3 = readToken(this);
              if (bVar3) {
                if ((this->token).type == tagEndType) {
                  this_local._7_1_ = 1;
                }
                else {
                  String::String<13ul>(&local_218,(char (*) [13])"Expected \'>\'");
                  syntaxError(this,&(this->token).pos,&local_218);
                  this_local._7_1_ = 0;
                  String::~String(&local_218);
                }
              }
              else {
                this_local._7_1_ = 0;
              }
            }
          }
          else {
            String::String<18ul>(&local_178,(char (*) [18])"Expected tag name");
            syntaxError(this,&(this->token).pos,&local_178);
            this_local._7_1_ = 0;
            String::~String(&local_178);
          }
        }
        else {
          this_local._7_1_ = 0;
        }
        break;
      }
      if ((this->token).type == startTagBeginType) {
        pLVar4 = &local_20->content;
        this_00 = &string._data.ref;
        Variant::Variant((Variant *)this_00);
        this_01 = List<Xml::Variant>::append(pLVar4,(Variant *)this_00);
        Variant::~Variant((Variant *)&string._data.ref);
        element_00 = Variant::toElement(this_01);
        bVar3 = parseElement(this,element_00);
        if (!bVar3) {
          this_local._7_1_ = 0;
          break;
        }
        goto LAB_0010c7d9;
      }
      (this->pos).line = iVar1;
      *(undefined4 *)&(this->pos).field_0x4 = uVar2;
      (this->pos).pos = (char *)pos._0_8_;
      (this->pos).lineStart = pos.pos;
    }
  }
LAB_0010cc48:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Xml::Private::parseElement(Element& element)
{
  element.line = token.pos.line;
  element.column = (int)(token.pos.pos - token.pos.lineStart) + 1;
  if(!readToken())
    return false;
  if(token.type != Token::nameType)
    return syntaxError(token.pos, "Expected tag name"), false;
  element.type = token.value;
  for(;;)
  {
    if(!readToken())
      return false;
    if(token.type == Token::emptyTagEndType)
      return true;
    if(token.type == Token::tagEndType)
      break;
    if(token.type == Token::nameType)
    {
      String attributeName = token.value;
      if(!readToken())
        return false;
      if(token.type != Token::equalsSignType)
        return syntaxError(token.pos, "Expected '='"), false;
      if(!readToken())
        return false;
      if(token.type != Token::stringType)
        return syntaxError(token.pos, "Expected string"), false;
      element.attributes.append(attributeName, token.value);
      continue;
    }
  }
  for(;;)
  {
    Position pos = this->pos;
    if(readToken())
    {
      if(token.type == Token::endTagBeginType)
        break;
      if(token.type == Token::startTagBeginType)
      {
        Variant& variant = element.content.append(Variant());
        if(!parseElement(variant.toElement()))
          return false;
        continue;
      }
      else
        this->pos = pos;
    }
    String string;
    if(!parseText(string))
      return false;
    element.content.append(string);
  }
  if(!readToken())
    return false;
  if(token.type != Token::nameType)
    return syntaxError(token.pos, "Expected tag name"), false;
  if(token.value != element.type)
    return syntaxError(token.pos, String("Expected end tag of '") + element.type + ("'")), false;
  if(!readToken())
    return false;
  if(token.type != Token::tagEndType)
    return syntaxError(token.pos, "Expected '>'"), false;
  return true;
}